

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O2

void Abc_NtkModelToVector(Abc_Ntk_t *pNtk,Vec_Int_t *vPiValues)

{
  int *piVar1;
  long lVar2;
  
  piVar1 = pNtk->pModel;
  for (lVar2 = 0; lVar2 < pNtk->vPis->nSize; lVar2 = lVar2 + 1) {
    Vec_IntWriteEntry(vPiValues,(int)lVar2,piVar1[lVar2]);
  }
  return;
}

Assistant:

void Abc_NtkModelToVector( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues )
{
    int * pModel, i;
    pModel = pNtk->pModel;
    for ( i = 0; i < Abc_NtkPiNum(pNtk); i++ )
        Vec_IntWriteEntry( vPiValues, i, pModel[i] );
}